

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path,WriteMode mode)

{
  PathPtr path_00;
  PathPtr path_01;
  bool bVar1;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *pDVar2;
  String *this_00;
  WriteMode in_R8D;
  Maybe<kj::Own<const_kj::Directory>_> MVar3;
  Maybe<kj::AutoCloseFd> local_5c;
  Maybe<kj::Own<kj::Directory>_> local_50;
  DiskHandle *local_40;
  String *local_38;
  WriteMode local_2c;
  String *pSStack_28;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (DiskHandle *)path.parts.size_;
  this_00 = path.parts.ptr;
  local_2c = in_R8D;
  pSStack_28 = this_00;
  path_local.parts.size_ = (size_t)this;
  bVar1 = has<kj::WriteMode,void>(in_R8D,CREATE);
  if (bVar1) {
    local_40 = this_local;
    local_38 = path_local.parts.ptr;
    path_01.parts.size_ = (size_t)path_local.parts.ptr;
    path_01.parts.ptr = (String *)this_local;
    bVar1 = tryMkdir((DiskHandle *)this_00,path_01,local_2c,false);
    if (!bVar1) {
      Maybe<kj::Own<const_kj::Directory>_>::Maybe
                ((Maybe<kj::Own<const_kj::Directory>_> *)this,(void *)0x0);
      pDVar2 = extraout_RDX;
      goto LAB_0040d2df;
    }
  }
  path_00.parts.size_ = (size_t)path_local.parts.ptr;
  path_00.parts.ptr = (String *)this_local;
  tryOpenSubdirInternal(&local_5c,(DiskHandle *)this_00,path_00);
  Maybe<kj::AutoCloseFd>::map<kj::Own<kj::Directory>_(&)(kj::AutoCloseFd)>
            ((Maybe<kj::AutoCloseFd> *)&local_50,(_func_Own<kj::Directory>_AutoCloseFd *)&local_5c);
  Maybe<kj::Own<const_kj::Directory>_>::Maybe<kj::Directory>
            ((Maybe<kj::Own<const_kj::Directory>_> *)this,&local_50);
  Maybe<kj::Own<kj::Directory>_>::~Maybe(&local_50);
  Maybe<kj::AutoCloseFd>::~Maybe(&local_5c);
  pDVar2 = extraout_RDX_00;
LAB_0040d2df:
  MVar3.ptr.ptr = pDVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const {
    // Must create before open.
    if (has(mode, WriteMode::CREATE)) {
      if (!tryMkdir(path, mode, false)) return nullptr;
    }

    return tryOpenSubdirInternal(path).map(newDiskDirectory);
  }